

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

void __thiscall Assimp::BVHLoader::CreateAnimation(BVHLoader *this,aiScene *pScene)

{
  undefined8 *puVar1;
  char *__s;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  aiNode *paVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_type sVar9;
  aiAnimation **ppaVar10;
  aiAnimation *paVar11;
  aiNodeAnim **ppaVar12;
  size_t sVar13;
  aiNodeAnim *paVar14;
  pointer pCVar15;
  mapped_type_conflict1 *pmVar16;
  aiVectorKey *paVar17;
  aiQuatKey *paVar18;
  runtime_error *prVar19;
  long lVar20;
  aiQuatKey *paVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  pointer pNVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  aiQuaternion aVar39;
  float fVar40;
  float fVar42;
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar48;
  undefined1 auVar46 [16];
  float fVar49;
  undefined1 auVar50 [12];
  float fVar52;
  undefined1 auVar51 [16];
  string nodeName;
  map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  channelMap;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  aiAnimation *local_a8;
  ulong local_a0;
  _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [24];
  undefined1 auVar47 [16];
  
  pScene->mNumAnimations = 1;
  ppaVar10 = (aiAnimation **)operator_new__(8);
  pScene->mAnimations = ppaVar10;
  paVar11 = (aiAnimation *)operator_new(0x448);
  memset((paVar11->mName).data + 7,0x1b,0x3f9);
  paVar11->mChannels = (aiNodeAnim **)0x0;
  paVar11->mNumMeshChannels = 0;
  paVar11->mMeshChannels = (aiMeshAnim **)0x0;
  paVar11->mNumMorphMeshChannels = 0;
  paVar11->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  *ppaVar10 = paVar11;
  (paVar11->mName).length = 6;
  builtin_strncpy((paVar11->mName).data,"Motion",7);
  paVar11->mTicksPerSecond = 1.0 / (double)this->mAnimTickDuration;
  paVar11->mDuration = (double)(this->mAnimNumFrames - 1);
  uVar27 = ((long)(this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  uVar25 = (uint)uVar27;
  paVar11->mNumChannels = uVar25;
  ppaVar12 = (aiNodeAnim **)operator_new__((uVar27 & 0xffffffff) << 3);
  paVar11->mChannels = ppaVar12;
  if (uVar25 == 0) {
    bVar32 = true;
  }
  else {
    uVar27 = 0;
    do {
      paVar11->mChannels[uVar27] = (aiNodeAnim *)0x0;
      uVar27 = uVar27 + 1;
    } while (uVar27 < paVar11->mNumChannels);
    bVar32 = paVar11->mNumChannels == 0;
  }
  if (!bVar32) {
    p_Var2 = &local_98._M_impl.super__Rb_tree_header;
    local_48._8_4_ = 0x3e800000;
    local_48._0_8_ = 0x3e800000;
    local_48._12_4_ = 0;
    uVar27 = 0;
    local_a8 = paVar11;
    do {
      paVar11 = local_a8;
      pNVar31 = (this->mNodes).
                super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar4 = pNVar31[uVar27].mNode;
      __s = (paVar4->mName).data;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      sVar13 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,__s,(long)(paVar4->mName).data + sVar13);
      paVar14 = (aiNodeAnim *)operator_new(0x438);
      (paVar14->mNodeName).length = 0;
      (paVar14->mNodeName).data[0] = '\0';
      memset((paVar14->mNodeName).data + 1,0x1b,0x3ff);
      sVar9 = local_c8._M_string_length;
      paVar14->mRotationKeys = (aiQuatKey *)0x0;
      paVar14->mNumScalingKeys = 0;
      *(undefined8 *)&paVar14->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar14->mPositionKeys + 4) = 0;
      paVar14->mScalingKeys = (aiVectorKey *)0x0;
      paVar14->mPreState = aiAnimBehaviour_DEFAULT;
      paVar14->mPostState = aiAnimBehaviour_DEFAULT;
      paVar11->mChannels[uVar27] = paVar14;
      local_a0 = uVar27;
      if (local_c8._M_string_length < 0x400) {
        (paVar14->mNodeName).length = (ai_uint32)local_c8._M_string_length;
        memcpy((paVar14->mNodeName).data,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        (paVar14->mNodeName).data[sVar9] = '\0';
      }
      pNVar31 = pNVar31 + uVar27;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar15 = (pNVar31->mChannels).
                super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      if (*(pointer *)
           ((long)&(pNVar31->mChannels).
                   super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                   ._M_impl + 8) == pCVar15) {
LAB_003e176f:
        paVar4 = pNVar31->mNode;
        fVar33 = (paVar4->mTransformation).a4;
        fVar34 = (paVar4->mTransformation).b4;
        fVar35 = (paVar4->mTransformation).c4;
        paVar14->mNumPositionKeys = 1;
        paVar17 = (aiVectorKey *)operator_new__(0x18);
        paVar14->mPositionKeys = paVar17;
        paVar17->mTime = 0.0;
        (paVar17->mValue).x = fVar33;
        (paVar17->mValue).y = fVar34;
        (paVar17->mValue).z = fVar35;
        uVar28 = (ulong)this->mAnimNumFrames;
        uVar27 = uVar28 * 0x18;
      }
      else {
        uVar27 = 0;
        do {
          pmVar16 = std::
                    map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                    ::operator[]((map<Assimp::BVHLoader::ChannelType,_int,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
                                  *)&local_98,pCVar15 + uVar27);
          *pmVar16 = (int)uVar27;
          uVar27 = (ulong)((int)uVar27 + 1);
          pCVar15 = (pNVar31->mChannels).
                    super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)*(pointer *)
                          ((long)&(pNVar31->mChannels).
                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                  ._M_impl + 8) - (long)pCVar15;
        } while (uVar27 < (ulong)(lVar20 >> 2));
        if (lVar20 != 0x18) goto LAB_003e176f;
        uVar25 = this->mAnimNumFrames;
        uVar28 = (ulong)uVar25;
        paVar14->mNumPositionKeys = uVar25;
        uVar27 = uVar28 * 0x18;
        paVar17 = (aiVectorKey *)operator_new__(uVar27);
        if (uVar25 != 0) {
          lVar20 = 0;
          do {
            puVar1 = (undefined8 *)((long)&paVar17->mTime + lVar20);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)&(paVar17->mValue).z + lVar20) = 0;
            lVar20 = lVar20 + 0x18;
          } while (uVar28 * 0x18 != lVar20);
        }
        paVar14->mPositionKeys = paVar17;
        if (uVar25 != 0) {
          uVar24 = 0;
LAB_003e1677:
          paVar17->mTime = (double)(uVar24 & 0xffffffff);
          if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_003e2067:
            prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_68,"Missing position channel in node ",&local_c8);
            std::runtime_error::runtime_error(prVar19,(string *)&local_68);
            *(undefined ***)prVar19 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar26 = 0;
          p_Var30 = &p_Var2->_M_header;
          p_Var23 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
LAB_003e1696:
          do {
            p_Var29 = p_Var23;
            p_Var22 = p_Var30;
            _Var3 = p_Var29[1]._M_color;
            p_Var30 = p_Var29;
            if ((int)_Var3 < iVar26) {
              p_Var30 = p_Var22;
            }
            p_Var23 = (&p_Var29->_M_left)[(int)_Var3 < iVar26];
          } while ((&p_Var29->_M_left)[(int)_Var3 < iVar26] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var30 == p_Var2) goto LAB_003e2067;
          if ((int)_Var3 < iVar26) {
            p_Var29 = p_Var22;
          }
          if (iVar26 < (int)p_Var29[1]._M_color) goto LAB_003e2067;
          lVar20 = (long)*(int *)&p_Var30[1].field_0x4;
          if (iVar26 == 0) {
            (paVar17->mValue).x =
                 *(float *)(((ulong)((long)*(pointer *)
                                            ((long)&(pNVar31->mChannels).
                                                                                                        
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pNVar31->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * uVar24 * 4 +
                            *(long *)&(pNVar31->mChannelValues).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + lVar20 * 4);
          }
          else if (iVar26 == 1) {
            (paVar17->mValue).y =
                 *(float *)(((ulong)((long)*(pointer *)
                                            ((long)&(pNVar31->mChannels).
                                                                                                        
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                    *(long *)&(pNVar31->mChannels).
                                              super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * uVar24 * 4 +
                            *(long *)&(pNVar31->mChannelValues).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + lVar20 * 4);
          }
          else if (iVar26 == 2) goto LAB_003e1738;
          iVar26 = iVar26 + 1;
          p_Var30 = &p_Var2->_M_header;
          p_Var23 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
          goto LAB_003e1696;
        }
      }
LAB_003e17f4:
      uVar25 = (uint)uVar28;
      paVar14->mNumRotationKeys = uVar25;
      paVar18 = (aiQuatKey *)operator_new__(uVar27);
      if (uVar25 == 0) {
        paVar14->mRotationKeys = paVar18;
      }
      else {
        paVar21 = paVar18;
        do {
          paVar21->mTime = 0.0;
          (paVar21->mValue).w = 1.0;
          (paVar21->mValue).x = 0.0;
          (paVar21->mValue).y = 0.0;
          (paVar21->mValue).z = 0.0;
          paVar21 = paVar21 + 1;
        } while (paVar21 != paVar18 + uVar28);
        paVar14->mRotationKeys = paVar18;
        if (uVar25 != 0) {
          uVar27 = 0;
LAB_003e184e:
          if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_003e200a:
            prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_68,"Missing rotation channel in node ",&local_c8);
            std::runtime_error::runtime_error(prVar19,(string *)&local_68);
            *(undefined ***)prVar19 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          _local_118 = ZEXT816(0);
          iVar26 = 3;
          _local_f8 = ZEXT816(0x3f800000);
          _local_108 = ZEXT812(0x3f80000000000000);
          fStack_fc = 1.0;
          p_Var30 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var23 = &p_Var2->_M_header;
LAB_003e1888:
          do {
            p_Var22 = p_Var23;
            p_Var29 = p_Var30;
            _Var3 = p_Var29[1]._M_color;
            p_Var23 = p_Var29;
            if ((int)_Var3 < iVar26) {
              p_Var23 = p_Var22;
            }
            p_Var30 = (&p_Var29->_M_left)[(int)_Var3 < iVar26];
          } while ((&p_Var29->_M_left)[(int)_Var3 < iVar26] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var23 == p_Var2) goto LAB_003e200a;
          if ((int)_Var3 < iVar26) {
            p_Var29 = p_Var22;
          }
          if (iVar26 < (int)p_Var29[1]._M_color) goto LAB_003e200a;
          fVar33 = (*(float *)(((ulong)((long)*(pointer *)
                                               ((long)&(pNVar31->mChannels).
                                                                                                              
                                                  super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                  ._M_impl + 8) -
                                       *(long *)&(pNVar31->mChannels).
                                                 super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                                 ._M_impl.super__Vector_impl_data) >> 2) * uVar27 *
                               4 + *(long *)&(pNVar31->mChannelValues).
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data +
                              (long)*(int *)&p_Var23[1].field_0x4 * 4) * 3.1415927) / 180.0;
          if (iVar26 == 3) {
            fVar34 = cosf(fVar33);
            fVar33 = sinf(fVar33);
            fVar35 = (float)local_108._0_4_ * 0.0;
            fVar40 = fStack_100 * fVar33;
            auVar38._0_4_ =
                 (float)local_118._0_4_ * fVar34 +
                 (fStack_fc * 0.0 - (float)local_108._0_4_ * fVar33);
            auVar38._4_4_ = fStack_110 * 0.0 + (float)local_108._4_4_ * 0.0 + (float)local_118._4_4_
            ;
            auVar38._8_4_ =
                 fStack_110 * fVar34 +
                 ((float)local_118._4_4_ * 0.0 - (float)local_108._4_4_ * fVar33);
            auVar38._12_4_ = (float)local_f8._0_4_ * 0.0 + fStack_100 * 0.0 + fStack_10c;
            local_108._0_4_ =
                 (float)local_108._0_4_ * fVar34 + fStack_fc * 0.0 + (float)local_118._0_4_ * fVar33
            ;
            local_108._4_4_ =
                 (float)local_118._4_4_ * 0.0 + fVar34 * (float)local_108._4_4_ +
                 fStack_110 * fVar33;
            fStack_100 = fStack_10c * 0.0 + fVar34 * fStack_100 + (float)local_f8._0_4_ * fVar33;
            fStack_fc = fVar35 + fStack_fc + (float)local_118._0_4_ * 0.0;
            local_f8._4_4_ = extraout_XMM0_Db_00;
            local_f8._0_4_ = fVar34 * (float)local_f8._0_4_ + (fStack_10c * 0.0 - fVar40);
            uStack_f0 = extraout_XMM0_Dc_00;
            uStack_ec = extraout_XMM0_Dd_00;
          }
          else if (iVar26 == 4) {
            fVar34 = cosf(fVar33);
            fVar33 = sinf(fVar33);
            fVar36 = (float)local_108._0_4_ * 0.0;
            fVar43 = fVar33 * fStack_fc;
            fVar44 = fVar33 * (float)local_118._4_4_;
            fVar35 = -fVar33;
            fVar40 = (float)local_108._4_4_ * 0.0;
            fVar42 = fStack_100 * 0.0;
            local_108._4_4_ =
                 (float)local_108._4_4_ + (float)local_118._4_4_ * 0.0 + fStack_110 * 0.0;
            local_108._0_4_ =
                 (float)local_108._0_4_ + fStack_fc * 0.0 + (float)local_118._0_4_ * 0.0;
            fStack_100 = fStack_100 + fStack_10c * 0.0 + (float)local_f8._0_4_ * 0.0;
            fStack_fc = fVar36 + fVar34 * fStack_fc + fVar35 * (float)local_118._0_4_;
            fVar45 = fVar35 * (float)local_f8._0_4_;
            local_f8._4_4_ = extraout_XMM0_Db;
            local_f8._0_4_ = fVar34 * (float)local_f8._0_4_ + fStack_10c * fVar33 + fVar42;
            uStack_f0 = extraout_XMM0_Dc;
            uStack_ec = extraout_XMM0_Dd;
            local_118._4_4_ = fVar35 * fStack_110 + fVar40 + fVar34 * (float)local_118._4_4_;
            local_118._0_4_ = fVar34 * (float)local_118._0_4_ + fVar36 + fVar43;
            fStack_110 = fVar34 * fStack_110 + fVar40 + fVar44;
            fStack_10c = fVar45 + fVar42 + fVar34 * fStack_10c;
            auVar38 = _local_118;
          }
          else {
            auVar38 = _local_118;
            if (iVar26 == 5) goto LAB_003e1ba1;
          }
          _local_118 = auVar38;
          iVar26 = iVar26 + 1;
          p_Var30 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var23 = &p_Var2->_M_header;
          if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
          goto LAB_003e200a;
          goto LAB_003e1888;
        }
      }
LAB_003e1f79:
      paVar14->mNumScalingKeys = 1;
      paVar17 = (aiVectorKey *)operator_new__(0x18);
      paVar14->mScalingKeys = paVar17;
      paVar17->mTime = 0.0;
      (paVar17->mValue).x = 1.0;
      (paVar17->mValue).y = 1.0;
      (paVar17->mValue).z = 1.0;
      std::
      _Rb_tree<Assimp::BVHLoader::ChannelType,_std::pair<const_Assimp::BVHLoader::ChannelType,_int>,_std::_Select1st<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>,_std::less<Assimp::BVHLoader::ChannelType>,_std::allocator<std::pair<const_Assimp::BVHLoader::ChannelType,_int>_>_>
      ::~_Rb_tree(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      uVar27 = local_a0 + 1;
    } while (uVar27 < local_a8->mNumChannels);
  }
  return;
LAB_003e1738:
  (paVar17->mValue).z =
       *(float *)(((ulong)((long)*(pointer *)
                                  ((long)&(pNVar31->mChannels).
                                          super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                          ._M_impl + 8) -
                          *(long *)&(pNVar31->mChannels).
                                    super__Vector_base<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                                    ._M_impl.super__Vector_impl_data) >> 2) * uVar24 * 4 +
                  *(long *)&(pNVar31->mChannelValues).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data + lVar20 * 4);
  paVar17 = paVar17 + 1;
  uVar24 = uVar24 + 1;
  if (uVar24 == uVar28) goto LAB_003e17f4;
  goto LAB_003e1677;
LAB_003e1ba1:
  fVar34 = cosf(fVar33);
  fVar33 = sinf(fVar33);
  fVar35 = (float)local_118._0_4_ * 0.0 + fStack_fc * fVar34 + (float)local_108._0_4_ * fVar33;
  fVar45 = (float)local_118._0_4_ + fStack_fc * 0.0 + (float)local_108._0_4_ * 0.0;
  fVar48 = fStack_110 + (float)local_118._4_4_ * 0.0 + (float)local_108._4_4_ * 0.0;
  fVar49 = fStack_110 * 0.0 + (float)local_118._4_4_ * fVar34 + (float)local_108._4_4_ * fVar33;
  fVar52 = (float)local_f8._0_4_ * 0.0 + fStack_10c * fVar34 + fStack_100 * fVar33;
  fVar43 = (float)local_118._0_4_ * 0.0 + ((float)local_108._0_4_ * fVar34 - fStack_fc * fVar33);
  fVar44 = (float)local_f8._0_4_ * 0.0 + (fStack_100 * fVar34 - fStack_10c * fVar33);
  paVar18->mTime = (double)(uVar27 & 0xffffffff);
  fVar36 = fStack_110 * 0.0 + ((float)local_108._4_4_ * fVar34 - (float)local_118._4_4_ * fVar33);
  fVar42 = (float)local_f8._0_4_ + fStack_10c * 0.0 + fStack_100 * 0.0;
  fVar40 = fVar35 + fVar36 + fVar42;
  if (fVar40 <= 0.0) {
    if ((fVar35 <= fVar36) || (fVar35 <= fVar42)) {
      if (fVar36 <= fVar42) {
        fVar36 = ((fVar42 + 1.0) - fVar35) - fVar36;
        if (fVar36 < 0.0) {
          fVar36 = sqrtf(fVar36);
        }
        else {
          fVar36 = SQRT(fVar36);
        }
        fVar36 = fVar36 + fVar36;
        auVar51._0_4_ = fVar49 - fVar43;
        auVar51._4_4_ = fVar45 + fVar52;
        auVar51._8_4_ = fVar48 + fVar44;
        auVar51._12_4_ =
             fStack_10c + fStack_fc * 0.0 + fStack_fc * 0.0 +
             (float)local_f8._4_4_ * 0.0 + fStack_10c * fVar34 + fStack_fc * fVar33;
        auVar7._4_4_ = fVar36;
        auVar7._0_4_ = fVar36;
        auVar7._8_4_ = fVar36;
        auVar7._12_4_ = fVar36;
        auVar38 = divps(auVar51,auVar7);
        auVar50 = auVar38._0_12_;
        aVar39.z = fVar36 * 0.25;
        aVar39.w = (float)auVar50._0_4_;
        aVar39.x = (float)auVar50._4_4_;
        aVar39.y = (float)auVar50._8_4_;
      }
      else {
        fVar42 = ((fVar36 + 1.0) - fVar35) - fVar42;
        if (fVar42 < 0.0) {
          fVar42 = sqrtf(fVar42);
        }
        else {
          fVar42 = SQRT(fVar42);
        }
        fVar42 = fVar42 + fVar42;
        auVar46._0_4_ = fVar45 - fVar52;
        auVar47._4_4_ = fVar48 - fVar52;
        auVar47._0_4_ = auVar46._0_4_;
        auVar47._8_4_ = auVar47._4_4_;
        auVar47._12_4_ = fVar44 + fVar48;
        auVar46._8_8_ = auVar47._8_8_;
        auVar46._4_4_ = fVar43 + fVar49;
        auVar6._4_4_ = fVar42;
        auVar6._0_4_ = fVar42;
        auVar6._8_4_ = fVar42;
        auVar6._12_4_ = fVar42;
        auVar38 = divps(auVar46,auVar6);
        aVar39.y = fVar42 * (float)local_48._8_4_;
        aVar39.w = (float)(int)auVar38._0_8_;
        aVar39.x = (float)(int)((ulong)auVar38._0_8_ >> 0x20);
        aVar39.z = auVar38._12_4_;
      }
    }
    else {
      fVar42 = ((fVar35 + 1.0) - fVar36) - fVar42;
      if (fVar42 < 0.0) {
        fVar42 = sqrtf(fVar42);
      }
      else {
        fVar42 = SQRT(fVar42);
      }
      fVar42 = fVar42 + fVar42;
      auVar41._4_4_ = fVar42;
      auVar41._0_4_ = fVar44 - fVar48;
      auVar41._12_4_ = fVar45 + fVar52;
      auVar41._8_4_ = fVar43 + fVar49;
      auVar5._4_4_ = fVar42;
      auVar5._0_4_ = fVar42;
      auVar5._8_4_ = fVar42;
      auVar5._12_4_ = fVar42;
      auVar38 = divps(auVar41,auVar5);
      aVar39.x = fVar42 * 0.25;
      aVar39.w = (float)auVar38._0_4_;
      aVar39.y = (float)auVar38._8_4_;
      aVar39.z = auVar38._12_4_;
    }
  }
  else {
    fVar40 = fVar40 + 1.0;
    if (fVar40 < 0.0) {
      fVar40 = sqrtf(fVar40);
    }
    else {
      fVar40 = SQRT(fVar40);
    }
    fVar40 = fVar40 * 2.0;
    auVar37._0_4_ = fVar43 - fVar48;
    auVar37._4_4_ = fVar44 - fVar48;
    auVar37._8_4_ = fVar45 - fVar52;
    auVar37._12_4_ = fVar49 - fVar43;
    auVar8._4_4_ = fVar40;
    auVar8._0_4_ = fVar40;
    auVar8._8_4_ = fVar40;
    auVar8._12_4_ = fVar40;
    auVar38 = divps(auVar37,auVar8);
    aVar39._4_12_ = auVar38._4_12_;
    aVar39.w = fVar40 * 0.25;
  }
  paVar18->mValue = aVar39;
  paVar18 = paVar18 + 1;
  uVar27 = uVar27 + 1;
  if (this->mAnimNumFrames <= uVar27) goto LAB_003e1f79;
  goto LAB_003e184e;
}

Assistant:

void BVHLoader::CreateAnimation( aiScene* pScene)
{
    // create the animation
    pScene->mNumAnimations = 1;
    pScene->mAnimations = new aiAnimation*[1];
    aiAnimation* anim = new aiAnimation;
    pScene->mAnimations[0] = anim;

    // put down the basic parameters
    anim->mName.Set( "Motion");
    anim->mTicksPerSecond = 1.0 / double( mAnimTickDuration);
    anim->mDuration = double( mAnimNumFrames - 1);

    // now generate the tracks for all nodes
    anim->mNumChannels = static_cast<unsigned int>(mNodes.size());
    anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // FIX: set the array elements to NULL to ensure proper deletion if an exception is thrown
    for (unsigned int i = 0; i < anim->mNumChannels;++i)
        anim->mChannels[i] = NULL;

    for( unsigned int a = 0; a < anim->mNumChannels; a++)
    {
        const Node& node = mNodes[a];
        const std::string nodeName = std::string( node.mNode->mName.data );
        aiNodeAnim* nodeAnim = new aiNodeAnim;
        anim->mChannels[a] = nodeAnim;
        nodeAnim->mNodeName.Set( nodeName);
		std::map<BVHLoader::ChannelType, int> channelMap;

		//Build map of channels 
		for (unsigned int channel = 0; channel < node.mChannels.size(); ++channel)
		{
			channelMap[node.mChannels[channel]] = channel;
		}

        // translational part, if given
        if( node.mChannels.size() == 6)
        {
            nodeAnim->mNumPositionKeys = mAnimNumFrames;
            nodeAnim->mPositionKeys = new aiVectorKey[mAnimNumFrames];
            aiVectorKey* poskey = nodeAnim->mPositionKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                poskey->mTime = double( fr);

                // Now compute all translations 
                for(BVHLoader::ChannelType channel = Channel_PositionX; channel <= Channel_PositionZ; channel = (BVHLoader::ChannelType)(channel +1))
                {
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing position channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						switch (channel) {
						    case Channel_PositionX: 
                                poskey->mValue.x = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionY: 
                                poskey->mValue.y = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
						    case Channel_PositionZ: 
                                poskey->mValue.z = node.mChannelValues[fr * node.mChannels.size() + channelIdx]; 
                                break;
                                
                            default:
                                break;
						}

					}
                }
                ++poskey;
            }
        } else
        {
            // if no translation part is given, put a default sequence
            aiVector3D nodePos( node.mNode->mTransformation.a4, node.mNode->mTransformation.b4, node.mNode->mTransformation.c4);
            nodeAnim->mNumPositionKeys = 1;
            nodeAnim->mPositionKeys = new aiVectorKey[1];
            nodeAnim->mPositionKeys[0].mTime = 0.0;
            nodeAnim->mPositionKeys[0].mValue = nodePos;
        }

        // rotation part. Always present. First find value offsets
        {

            // Then create the number of rotation keys
            nodeAnim->mNumRotationKeys = mAnimNumFrames;
            nodeAnim->mRotationKeys = new aiQuatKey[mAnimNumFrames];
            aiQuatKey* rotkey = nodeAnim->mRotationKeys;
            for( unsigned int fr = 0; fr < mAnimNumFrames; ++fr)
            {
                aiMatrix4x4 temp;
                aiMatrix3x3 rotMatrix;
				for (BVHLoader::ChannelType channel = Channel_RotationX; channel <= Channel_RotationZ; channel = (BVHLoader::ChannelType)(channel + 1))
				{
					//Find channel in node
					std::map<BVHLoader::ChannelType, int>::iterator mapIter = channelMap.find(channel);

					if (mapIter == channelMap.end())
						throw DeadlyImportError("Missing rotation channel in node " + nodeName);
					else {
						int channelIdx = mapIter->second;
						// translate ZXY euler angels into a quaternion
						const float angle = node.mChannelValues[fr * node.mChannels.size() + channelIdx] * float(AI_MATH_PI) / 180.0f;

						// Compute rotation transformations in the right order
						switch (channel)
						{
							case Channel_RotationX: 
                                aiMatrix4x4::RotationX(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
							case Channel_RotationY: 
                                aiMatrix4x4::RotationY(angle, temp); rotMatrix *= aiMatrix3x3(temp);  
                                break;
							case Channel_RotationZ: aiMatrix4x4::RotationZ(angle, temp); rotMatrix *= aiMatrix3x3(temp); 
                                break;
                            default:
                                break;
						}
					}
                }

                rotkey->mTime = double( fr);
                rotkey->mValue = aiQuaternion( rotMatrix);
                ++rotkey;
            }
        }

        // scaling part. Always just a default track
        {
            nodeAnim->mNumScalingKeys = 1;
            nodeAnim->mScalingKeys = new aiVectorKey[1];
            nodeAnim->mScalingKeys[0].mTime = 0.0;
            nodeAnim->mScalingKeys[0].mValue.Set( 1.0f, 1.0f, 1.0f);
        }
    }
}